

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
VulkanHppGenerator::generateRAIIHandleConstructor1Return2Vector
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,VulkanHppGenerator *this,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>
          *handle,const_iterator constructorIt,string *enter,string *leave,size_t returnParam,
          map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          *vectorParams)

{
  _Base_ptr p_Var1;
  bool bVar2;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
  _Var3;
  VulkanHppGenerator *this_00;
  string local_70;
  string singularConstructor;
  
  _Var3 = std::
          next<std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,VulkanHppGenerator::VectorParamData>>>
                    ((vectorParams->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,1);
  if ((((*(size_t *)(_Var3._M_node + 1) == returnParam) &&
       (_Var3._M_node = (vectorParams->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
       p_Var1 = _Var3._M_node[1]._M_parent,
       _Var3 = std::
               next<std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,VulkanHppGenerator::VectorParamData>>>
                         (_Var3,1), p_Var1 == _Var3._M_node[1]._M_parent)) &&
      (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)constructorIt._M_node[5]._M_parent +
                               (long)(vectorParams->_M_t)._M_impl.super__Rb_tree_header._M_header.
                                     _M_left[1]._M_parent * 0x108 + 0x20),"uint32_t"), bVar2)) &&
     ((bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)constructorIt._M_node[5]._M_parent +
                               *(long *)((vectorParams->_M_t)._M_impl.super__Rb_tree_header.
                                         _M_header._M_left + 1) * 0x108 + 0x20),"void"), !bVar2 &&
      (this_00 = this,
      bVar2 = isHandleType(this,(string *)
                                ((long)constructorIt._M_node[5]._M_parent +
                                *(long *)((vectorParams->_M_t)._M_impl.super__Rb_tree_header.
                                          _M_header._M_left + 1) * 0x108 + 0x20)), !bVar2)))) {
    singularConstructor._M_dataplus._M_p = (pointer)&singularConstructor.field_2;
    singularConstructor._M_string_length = 0;
    singularConstructor.field_2._M_local_buf[0] = '\0';
    bVar2 = checkEquivalentSingularConstructor
                      (this_00,&(handle->second).constructorIts,constructorIt,
                       (ParamData *)
                       ((long)(vectorParams->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left
                              [1]._M_parent * 0x108 + (long)constructorIt._M_node[5]._M_parent));
    if (!bVar2) {
      generateRAIIHandleConstructorByCall(&local_70,this,handle,constructorIt,enter,leave,true,true)
      ;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&singularConstructor,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
    }
    generateRAIIHandleConstructorByCall(&local_70,this,handle,constructorIt,enter,leave,true,false);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (__return_storage_ptr__,&singularConstructor,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&singularConstructor);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->first)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->first).field_2;
  (__return_storage_ptr__->first)._M_string_length = 0;
  (__return_storage_ptr__->first).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->second)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->second).field_2;
  (__return_storage_ptr__->second)._M_string_length = 0;
  (__return_storage_ptr__->second).field_2._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::string, std::string>
  VulkanHppGenerator::generateRAIIHandleConstructor1Return2Vector( std::pair<std::string, HandleData> const &         handle,
                                                                   std::map<std::string, CommandData>::const_iterator constructorIt,
                                                                   std::string const &                                enter,
                                                                   std::string const &                                leave,
                                                                   size_t                                             returnParam,
                                                                   std::map<size_t, VectorParamData> const &          vectorParams ) const
{
  if ( returnParam == std::next( vectorParams.begin() )->first )
  {
    if ( vectorParams.begin()->second.lenParam == std::next( vectorParams.begin() )->second.lenParam )
    {
      if ( constructorIt->second.params[vectorParams.begin()->second.lenParam].type.type == "uint32_t" )
      {
        if ( ( constructorIt->second.params[vectorParams.begin()->first].type.type != "void" ) &&
             !isHandleType( constructorIt->second.params[vectorParams.begin()->first].type.type ) )
        {
          std::string singularConstructor;
          auto        lenParamIt = constructorIt->second.params.begin() + vectorParams.begin()->second.lenParam;
          if ( !checkEquivalentSingularConstructor( handle.second.constructorIts, constructorIt, lenParamIt ) )
          {
            singularConstructor = generateRAIIHandleConstructorByCall( handle, constructorIt, enter, leave, true, true );
          }
          return { singularConstructor, generateRAIIHandleConstructorByCall( handle, constructorIt, enter, leave, true, false ) };
        }
      }
    }
  }
  return {};
}